

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O3

void __thiscall
jrtplib::RTPSources::NoteTimeout(RTPSources *this,RTPTime *curtime,RTPTime *timeoutdelay)

{
  RTPTime *pRVar1;
  RTPInternalSourceData *this_00;
  int iVar2;
  HashElement *pHVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  double dVar8;
  
  dVar8 = curtime->m_t - timeoutdelay->m_t;
  pHVar3 = (this->sourcelist).firsthashelem;
  (this->sourcelist).curhashelem = pHVar3;
  if (pHVar3 == (HashElement *)0x0) {
    iVar5 = 0;
    iVar7 = 0;
    iVar6 = 0;
  }
  else {
    iVar7 = 0;
    iVar5 = 0;
    iVar2 = 1;
    do {
      iVar6 = iVar2;
      this_00 = pHVar3->element;
      if (((this_00->super_RTPSourceData).SDESinf.nonprivateitems[6].length != 0) &&
         (pRVar1 = &(this_00->super_RTPSourceData).stats.lastnotetime,
         pRVar1->m_t <= dVar8 && dVar8 != pRVar1->m_t)) {
        RTPInternalSourceData::ClearNote(this_00);
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x12])(this,this_00);
        pHVar3 = (this->sourcelist).curhashelem;
      }
      iVar5 = iVar5 + (uint)(this_00->super_RTPSourceData).issender;
      uVar4 = (this_00->super_RTPSourceData).receivedbye ^ 1;
      if ((this_00->super_RTPSourceData).validated == false) {
        uVar4 = 0;
      }
      iVar7 = iVar7 + uVar4;
      if (pHVar3 == (HashElement *)0x0) break;
      pHVar3 = pHVar3->listnext;
      (this->sourcelist).curhashelem = pHVar3;
      iVar2 = iVar6 + 1;
    } while (pHVar3 != (HashElement *)0x0);
  }
  this->totalcount = iVar6;
  this->sendercount = iVar5;
  this->activecount = iVar7;
  return;
}

Assistant:

void RTPSources::NoteTimeout(const RTPTime &curtime,const RTPTime &timeoutdelay)
{
	int newtotalcount = 0;
	int newsendercount = 0;
	int newactivecount = 0;
	RTPTime checktime = curtime;
	checktime -= timeoutdelay;
	
	sourcelist.GotoFirstElement();
	while (sourcelist.HasCurrentElement())
	{
		RTPInternalSourceData *srcdat = sourcelist.GetCurrentElement();
		size_t notelen;

        	srcdat->SDES_GetNote(&notelen);
		if (notelen != 0) // Note has been set
		{
			RTPTime notetime = srcdat->INF_GetLastSDESNoteTime();
			
			if (checktime > notetime)
			{
				srcdat->ClearNote();
				OnNoteTimeout(srcdat);
			}
		}
		
		newtotalcount++;
		if (srcdat->IsSender())
			newsendercount++;
		if (srcdat->IsActive())
			newactivecount++;
		sourcelist.GotoNextElement();
	}
	
#ifdef RTPDEBUG
	if (newtotalcount != totalcount)
	{
		std::cout << "New total count " << newtotalcount << " doesnt match old total count " << totalcount << std::endl;
		SafeCountTotal();
	}
	if (newsendercount != sendercount)
	{
		std::cout << "New sender count " << newsendercount << " doesnt match old sender count " << sendercount << std::endl;
		SafeCountSenders();
	}
	if (newactivecount != activecount)
	{
		std::cout << "New active count " << newactivecount << " doesnt match old active count " << activecount << std::endl;
		SafeCountActive();
	}
#endif // RTPDEBUG
	
	totalcount = newtotalcount; // just to play it safe
	sendercount = newsendercount;
	activecount = newactivecount;

}